

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseSubstitution(State *state)

{
  bool bVar1;
  undefined **local_50;
  AbbrevPair *p;
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  bVar1 = ParseTwoCharToken(state,"S_");
  if (bVar1) {
    MaybeAppend((State *)copy._40_8_,"?");
    state_local._7_1_ = true;
  }
  else {
    memcpy(&p,(void *)copy._40_8_,0x30);
    bVar1 = ParseOneCharToken((State *)copy._40_8_,'S');
    if (((bVar1) && (bVar1 = ParseSeqId((State *)copy._40_8_), bVar1)) &&
       (bVar1 = ParseOneCharToken((State *)copy._40_8_,'_'), bVar1)) {
      MaybeAppend((State *)copy._40_8_,"?");
      state_local._7_1_ = true;
    }
    else {
      memcpy((void *)copy._40_8_,&p,0x30);
      bVar1 = ParseOneCharToken((State *)copy._40_8_,'S');
      if (bVar1) {
        for (local_50 = &kSubstitutionList; *local_50 != (undefined *)0x0; local_50 = local_50 + 2)
        {
          if (**(char **)copy._40_8_ == (*local_50)[1]) {
            MaybeAppend((State *)copy._40_8_,"std");
            if (*local_50[1] != '\0') {
              MaybeAppend((State *)copy._40_8_,"::");
              MaybeAppend((State *)copy._40_8_,local_50[1]);
            }
            *(long *)copy._40_8_ = *(long *)copy._40_8_ + 1;
            return true;
          }
        }
      }
      memcpy((void *)copy._40_8_,&p,0x30);
      state_local._7_1_ = false;
    }
  }
  return state_local._7_1_;
}

Assistant:

static bool ParseSubstitution(State *state) {
  if (ParseTwoCharToken(state, "S_")) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }

  State copy = *state;
  if (ParseOneCharToken(state, 'S') && ParseSeqId(state) &&
      ParseOneCharToken(state, '_')) {
    MaybeAppend(state, "?");  // We don't support substitutions.
    return true;
  }
  *state = copy;

  // Expand abbreviations like "St" => "std".
  if (ParseOneCharToken(state, 'S')) {
    const AbbrevPair *p;
    for (p = kSubstitutionList; p->abbrev != NULL; ++p) {
      if (state->mangled_cur[0] == p->abbrev[1]) {
        MaybeAppend(state, "std");
        if (p->real_name[0] != '\0') {
          MaybeAppend(state, "::");
          MaybeAppend(state, p->real_name);
        }
        ++state->mangled_cur;
        return true;
      }
    }
  }
  *state = copy;
  return false;
}